

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publickey.c
# Opt level: O1

LIBSSH2_PUBLICKEY * libssh2_publickey_init(LIBSSH2_SESSION *session)

{
  uchar **data;
  size_t *data_len;
  uchar *puVar1;
  uchar *puVar2;
  int iVar3;
  uint32_t uVar4;
  time_t start_time;
  LIBSSH2_CHANNEL *pLVar5;
  LIBSSH2_PUBLICKEY *pLVar6;
  ssize_t sVar7;
  ulong uVar8;
  char *pcVar9;
  LIBSSH2_PUBLICKEY **ppLVar10;
  uchar *puVar11;
  uchar *local_70;
  LIBSSH2_PUBLICKEY **local_68;
  time_t local_60;
  uint32_t local_54;
  uchar *local_50;
  uchar *local_48;
  uchar *local_40;
  uchar *local_38;
  
  start_time = time((time_t *)0x0);
  ppLVar10 = &session->pkeyInit_pkey;
  local_50 = session->pkeyInit_buffer;
  local_38 = session->pkeyInit_buffer + 4;
  local_40 = session->pkeyInit_buffer + 8;
  local_48 = session->pkeyInit_buffer + 0xf;
  data = &session->pkeyInit_data;
  data_len = &session->pkeyInit_data_len;
  do {
    if (session->pkeyInit_state == libssh2_NB_state_idle) {
      *ppLVar10 = (LIBSSH2_PUBLICKEY *)0x0;
      ppLVar10[1] = (LIBSSH2_PUBLICKEY *)0x0;
      ppLVar10[2] = (LIBSSH2_PUBLICKEY *)0x0;
      session->pkeyInit_state = libssh2_NB_state_allocated;
    }
    if (session->pkeyInit_state == libssh2_NB_state_allocated) {
      pLVar5 = _libssh2_channel_open(session,"session",7,0x200000,0x8000,(uchar *)0x0,0);
      session->pkeyInit_channel = pLVar5;
      if (pLVar5 != (LIBSSH2_CHANNEL *)0x0) {
        session->pkeyInit_state = libssh2_NB_state_sent;
        goto LAB_0011fe74;
      }
      iVar3 = libssh2_session_last_errno(session);
      pcVar9 = "Unable to startup channel";
      if (iVar3 != -0x25) {
LAB_0011fede:
        _libssh2_error(session,-0x15,pcVar9);
        goto LAB_001202c3;
      }
LAB_0012033d:
      pLVar6 = (LIBSSH2_PUBLICKEY *)0x0;
    }
    else {
LAB_0011fe74:
      if (session->pkeyInit_state == libssh2_NB_state_sent) {
        iVar3 = _libssh2_channel_process_startup
                          (session->pkeyInit_channel,"subsystem",9,"publickey",9);
        if (iVar3 == 0) {
          session->pkeyInit_state = libssh2_NB_state_sent1;
          goto LAB_0011fefa;
        }
        pcVar9 = "Unable to request publickey subsystem";
        if (iVar3 != -0x25) goto LAB_0011fede;
        pcVar9 = "Would block starting publickey subsystem";
LAB_001202f2:
        _libssh2_error(session,-0x25,pcVar9);
        goto LAB_0012033d;
      }
LAB_0011fefa:
      if (session->pkeyInit_state == libssh2_NB_state_sent1) {
        iVar3 = _libssh2_channel_extended_data(session->pkeyInit_channel,1);
        if (iVar3 == -0x25) {
          _libssh2_error(session,-0x25,"Would block starting publickey subsystem");
          iVar3 = 1;
        }
        else {
          pLVar6 = (LIBSSH2_PUBLICKEY *)_libssh2_calloc(session,0x80);
          session->pkeyInit_pkey = pLVar6;
          if (pLVar6 == (LIBSSH2_PUBLICKEY *)0x0) {
            _libssh2_error(session,-6,"Unable to allocate a new publickey structure");
            iVar3 = 4;
          }
          else {
            pLVar6->channel = session->pkeyInit_channel;
            pLVar6->version = 0;
            _libssh2_htonu32(local_50,0xf);
            _libssh2_htonu32(local_38,7);
            builtin_memcpy(local_40,"version",7);
            _libssh2_htonu32(local_48,2);
            session->pkeyInit_buffer_sent = 0;
            session->pkeyInit_state = libssh2_NB_state_sent2;
            iVar3 = 0;
          }
        }
        if (iVar3 == 4) goto LAB_001202c3;
        if (iVar3 != 0) goto LAB_0012033d;
      }
      if (session->pkeyInit_state == libssh2_NB_state_sent2) {
        sVar7 = _libssh2_channel_write
                          (session->pkeyInit_channel,0,local_50,0x13 - session->pkeyInit_buffer_sent
                          );
        if (sVar7 == -0x25) {
          pcVar9 = "Would block sending publickey version packet";
LAB_00120055:
          _libssh2_error(session,-0x25,pcVar9);
          iVar3 = 1;
        }
        else if (sVar7 < 0) {
          _libssh2_error(session,(int)sVar7,"Unable to send publickey version packet");
          iVar3 = 4;
        }
        else {
          uVar8 = session->pkeyInit_buffer_sent + sVar7;
          session->pkeyInit_buffer_sent = uVar8;
          if (uVar8 < 0x13) {
            pcVar9 = "Need to be called again to complete this";
            goto LAB_00120055;
          }
          session->pkeyInit_state = libssh2_NB_state_sent3;
          iVar3 = 0;
        }
        if (iVar3 == 4) goto LAB_001202c3;
        if (iVar3 != 0) goto LAB_0012033d;
      }
      if (session->pkeyInit_state != libssh2_NB_state_sent3) {
LAB_001202c3:
        session->pkeyInit_state = libssh2_NB_state_sent4;
        if ((session->pkeyInit_channel == (LIBSSH2_CHANNEL *)0x0) ||
           (iVar3 = _libssh2_channel_close(session->pkeyInit_channel), iVar3 != -0x25)) {
          if (session->pkeyInit_pkey != (LIBSSH2_PUBLICKEY *)0x0) {
            (*session->free)(session->pkeyInit_pkey,&session->abstract);
            session->pkeyInit_pkey = (LIBSSH2_PUBLICKEY *)0x0;
          }
          if (session->pkeyInit_data != (uchar *)0x0) {
            (*session->free)(session->pkeyInit_data,&session->abstract);
            session->pkeyInit_data = (uchar *)0x0;
          }
          session->pkeyInit_state = libssh2_NB_state_idle;
          goto LAB_0012033d;
        }
        pcVar9 = "Would block closing channel";
        goto LAB_001202f2;
      }
      pLVar6 = (LIBSSH2_PUBLICKEY *)0x0;
      do {
        iVar3 = publickey_packet_receive(session->pkeyInit_pkey,data,data_len);
        if (iVar3 == 0) {
          local_70 = *data;
          iVar3 = publickey_response_id(&local_70,*data_len);
          puVar1 = local_70;
          if (iVar3 < 0) {
            iVar3 = -0x24;
            pcVar9 = "Invalid publickey subsystem response code";
            goto LAB_00120132;
          }
          if (*data_len < 4) {
LAB_00120104:
            iVar3 = -0x26;
            pcVar9 = "Public key init data too small";
            goto LAB_00120132;
          }
          if (iVar3 == 1) {
            uVar4 = _libssh2_ntohu32(local_70);
            if (1 < uVar4) {
              uVar4 = 2;
            }
            session->pkeyInit_pkey->version = uVar4;
            (*session->free)(session->pkeyInit_data,&session->abstract);
            session->pkeyInit_data = (uchar *)0x0;
            session->pkeyInit_state = libssh2_NB_state_idle;
            pLVar6 = session->pkeyInit_pkey;
            iVar3 = 1;
          }
          else if (iVar3 == 0) {
            if (*data_len < 8) goto LAB_00120104;
            local_68 = ppLVar10;
            local_60 = start_time;
            local_54 = _libssh2_ntohu32(local_70);
            local_70 = puVar1 + 4;
            uVar4 = _libssh2_ntohu32(local_70);
            puVar11 = puVar1 + (ulong)uVar4 + 0xc;
            puVar2 = puVar1 + 8;
            if (puVar11 <= *data + *data_len) {
              local_70 = puVar1 + (ulong)uVar4 + 8;
              uVar4 = _libssh2_ntohu32(local_70);
              local_70 = puVar11 + uVar4;
              puVar2 = puVar11;
              if (local_70 <= *data + *data_len) {
                pcVar9 = "unknown";
                if (local_54 < 9) {
                  pcVar9 = publickey_status_codes[local_54].name;
                }
                iVar3 = -0x24;
                ppLVar10 = local_68;
                start_time = local_60;
                goto LAB_00120132;
              }
            }
            local_70 = puVar2;
            _libssh2_error(session,-0x26,"Public key init data too small");
            iVar3 = 4;
            ppLVar10 = local_68;
            start_time = local_60;
          }
          else {
            _libssh2_error(session,-0x24,"Unexpected publickey subsystem response, ignoring");
            (*session->free)(session->pkeyInit_data,&session->abstract);
            session->pkeyInit_data = (uchar *)0x0;
            iVar3 = 0;
          }
        }
        else {
          if (iVar3 == -0x25) {
            _libssh2_error(session,-0x25,"Would block waiting for response from publickey subsystem"
                          );
            iVar3 = 1;
            pLVar6 = (LIBSSH2_PUBLICKEY *)0x0;
            goto LAB_0012013c;
          }
          iVar3 = -0x1e;
          pcVar9 = "Timeout waiting for response from publickey subsystem";
LAB_00120132:
          _libssh2_error(session,iVar3,pcVar9);
          iVar3 = 4;
        }
LAB_0012013c:
      } while (iVar3 == 0);
      if (iVar3 == 4) goto LAB_001202c3;
    }
    if (session == (LIBSSH2_SESSION *)0x0) {
      return pLVar6;
    }
    if (session->api_block_mode == 0) {
      return pLVar6;
    }
    if (pLVar6 != (LIBSSH2_PUBLICKEY *)0x0) {
      return pLVar6;
    }
    iVar3 = libssh2_session_last_errno(session);
    if (iVar3 != -0x25) {
      return (LIBSSH2_PUBLICKEY *)0x0;
    }
    iVar3 = _libssh2_wait_socket(session,start_time);
    if (iVar3 != 0) {
      return (LIBSSH2_PUBLICKEY *)0x0;
    }
  } while( true );
}

Assistant:

static LIBSSH2_PUBLICKEY *publickey_init(LIBSSH2_SESSION *session)
{
    int response;
    int rc;

    if(session->pkeyInit_state == libssh2_NB_state_idle) {
        session->pkeyInit_data = NULL;
        session->pkeyInit_pkey = NULL;
        session->pkeyInit_channel = NULL;

        _libssh2_debug((session, LIBSSH2_TRACE_PUBLICKEY,
                       "Initializing publickey subsystem"));

        session->pkeyInit_state = libssh2_NB_state_allocated;
    }

    if(session->pkeyInit_state == libssh2_NB_state_allocated) {

        session->pkeyInit_channel =
            _libssh2_channel_open(session, "session",
                                  sizeof("session") - 1,
                                  LIBSSH2_CHANNEL_WINDOW_DEFAULT,
                                  LIBSSH2_CHANNEL_PACKET_DEFAULT, NULL,
                                  0);
        if(!session->pkeyInit_channel) {
            if(libssh2_session_last_errno(session) == LIBSSH2_ERROR_EAGAIN)
                /* The error state is already set, so leave it */
                return NULL;
            _libssh2_error(session, LIBSSH2_ERROR_CHANNEL_FAILURE,
                           "Unable to startup channel");
            goto err_exit;
        }

        session->pkeyInit_state = libssh2_NB_state_sent;
    }

    if(session->pkeyInit_state == libssh2_NB_state_sent) {
        rc = _libssh2_channel_process_startup(session->pkeyInit_channel,
                                              "subsystem",
                                              sizeof("subsystem") - 1,
                                              "publickey",
                                              sizeof("publickey") - 1);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block starting publickey subsystem");
            return NULL;
        }
        else if(rc) {
            _libssh2_error(session, LIBSSH2_ERROR_CHANNEL_FAILURE,
                           "Unable to request publickey subsystem");
            goto err_exit;
        }

        session->pkeyInit_state = libssh2_NB_state_sent1;
    }

    if(session->pkeyInit_state == libssh2_NB_state_sent1) {
        unsigned char *s;
        rc = _libssh2_channel_extended_data(session->pkeyInit_channel,
                                         LIBSSH2_CHANNEL_EXTENDED_DATA_IGNORE);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block starting publickey subsystem");
            return NULL;
        }

        session->pkeyInit_pkey =
            LIBSSH2_CALLOC(session, sizeof(LIBSSH2_PUBLICKEY));
        if(!session->pkeyInit_pkey) {
            _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                           "Unable to allocate a new publickey structure");
            goto err_exit;
        }
        session->pkeyInit_pkey->channel = session->pkeyInit_channel;
        session->pkeyInit_pkey->version = 0;

        s = session->pkeyInit_buffer;
        _libssh2_htonu32(s, 4 + (sizeof("version") - 1) + 4);
        s += 4;
        _libssh2_htonu32(s, sizeof("version") - 1);
        s += 4;
        memcpy(s, "version", sizeof("version") - 1);
        s += sizeof("version") - 1;
        _libssh2_htonu32(s, LIBSSH2_PUBLICKEY_VERSION);

        session->pkeyInit_buffer_sent = 0;

        _libssh2_debug((session, LIBSSH2_TRACE_PUBLICKEY,
                       "Sending publickey advertising version %d support",
                       (int) LIBSSH2_PUBLICKEY_VERSION));

        session->pkeyInit_state = libssh2_NB_state_sent2;
    }

    if(session->pkeyInit_state == libssh2_NB_state_sent2) {
        ssize_t nwritten;
        nwritten = _libssh2_channel_write(session->pkeyInit_channel, 0,
                                          session->pkeyInit_buffer,
                                          19 - session->pkeyInit_buffer_sent);
        if(nwritten == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block sending publickey version packet");
            return NULL;
        }
        else if(nwritten < 0) {
            _libssh2_error(session, (int)nwritten,
                           "Unable to send publickey version packet");
            goto err_exit;
        }
        session->pkeyInit_buffer_sent += nwritten;
        if(session->pkeyInit_buffer_sent < 19) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Need to be called again to complete this");
            return NULL;
        }

        session->pkeyInit_state = libssh2_NB_state_sent3;
    }

    if(session->pkeyInit_state == libssh2_NB_state_sent3) {
        for(;;) {
            unsigned char *s;
            rc = publickey_packet_receive(session->pkeyInit_pkey,
                                          &session->pkeyInit_data,
                                          &session->pkeyInit_data_len);
            if(rc == LIBSSH2_ERROR_EAGAIN) {
                _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                               "Would block waiting for response from "
                               "publickey subsystem");
                return NULL;
            }
            else if(rc) {
                _libssh2_error(session, LIBSSH2_ERROR_SOCKET_TIMEOUT,
                               "Timeout waiting for response from "
                               "publickey subsystem");
                goto err_exit;
            }

            s = session->pkeyInit_data;
            if((response =
                 publickey_response_id(&s, session->pkeyInit_data_len)) < 0) {
                _libssh2_error(session, LIBSSH2_ERROR_PUBLICKEY_PROTOCOL,
                               "Invalid publickey subsystem response code");
                goto err_exit;
            }

            if(session->pkeyInit_data_len < 4) {
                _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                               "Public key init data too small");
                goto err_exit;
            }

            switch(response) {
            case LIBSSH2_PUBLICKEY_RESPONSE_STATUS:
                /* Error */
            {
                unsigned long status, descr_len, lang_len;

                if(session->pkeyInit_data_len >= 8) {
                    status = _libssh2_ntohu32(s);
                    s += 4;
                    descr_len = _libssh2_ntohu32(s);
                    s += 4;
                }
                else {
                    _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                   "Public key init data too small");
                    goto err_exit;
                }

                if(s + descr_len + 4 <=
                   session->pkeyInit_data + session->pkeyInit_data_len) {
                    /* description starts here */
                    s += descr_len;
                    lang_len = _libssh2_ntohu32(s);
                    s += 4;
                }
                else {
                    _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                   "Public key init data too small");
                    goto err_exit;
                }

                if(s + lang_len <=
                   session->pkeyInit_data + session->pkeyInit_data_len) {
                    /* lang starts here */
                    s += lang_len;
                }
                else {
                    _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                   "Public key init data too small");
                    goto err_exit;
                }

                if(s >
                    session->pkeyInit_data + session->pkeyInit_data_len) {
                    _libssh2_error(session,
                                   LIBSSH2_ERROR_PUBLICKEY_PROTOCOL,
                                   "Malformed publickey subsystem packet");
                    goto err_exit;
                }

                publickey_status_error(NULL, session, status);

                goto err_exit;
            }

            case LIBSSH2_PUBLICKEY_RESPONSE_VERSION:
                /* What we want */
                session->pkeyInit_pkey->version = _libssh2_ntohu32(s);
                if(session->pkeyInit_pkey->version >
                    LIBSSH2_PUBLICKEY_VERSION) {
                    _libssh2_debug((session, LIBSSH2_TRACE_PUBLICKEY,
                                   "Truncate remote publickey version "
                                   "from %u",
                                   session->pkeyInit_pkey->version));
                    session->pkeyInit_pkey->version =
                        LIBSSH2_PUBLICKEY_VERSION;
                }
                _libssh2_debug((session, LIBSSH2_TRACE_PUBLICKEY,
                               "Enabling publickey subsystem version %u",
                               session->pkeyInit_pkey->version));
                LIBSSH2_FREE(session, session->pkeyInit_data);
                session->pkeyInit_data = NULL;
                session->pkeyInit_state = libssh2_NB_state_idle;
                return session->pkeyInit_pkey;

            default:
                /* Unknown/Unexpected */
                _libssh2_error(session, LIBSSH2_ERROR_PUBLICKEY_PROTOCOL,
                               "Unexpected publickey subsystem response, "
                               "ignoring");
                LIBSSH2_FREE(session, session->pkeyInit_data);
                session->pkeyInit_data = NULL;
            }
        }
    }

    /* Never reached except by direct goto */
err_exit:
    session->pkeyInit_state = libssh2_NB_state_sent4;
    if(session->pkeyInit_channel) {
        rc = _libssh2_channel_close(session->pkeyInit_channel);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block closing channel");
            return NULL;
        }
    }
    if(session->pkeyInit_pkey) {
        LIBSSH2_FREE(session, session->pkeyInit_pkey);
        session->pkeyInit_pkey = NULL;
    }
    if(session->pkeyInit_data) {
        LIBSSH2_FREE(session, session->pkeyInit_data);
        session->pkeyInit_data = NULL;
    }
    session->pkeyInit_state = libssh2_NB_state_idle;
    return NULL;
}